

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

int __thiscall
wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>::joinImpl<0ul,1ul>
          (Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice> *this,
          tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
          *joinee,tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
                  *joiner)

{
  bool bVar1;
  uint uVar2;
  __tuple_element_t<0UL,_tuple<RandomFullLattice,_RandomFullLattice>_> *this_00;
  __tuple_element_t<0UL,_tuple<RandomElement<RandomFullLattice>,_RandomElement<RandomFullLattice>_>_>
  *a;
  __tuple_element_t<0UL,_tuple<RandomElement<RandomFullLattice>,_RandomElement<RandomFullLattice>_>_>
  *b;
  Element *joiner_local;
  Element *joinee_local;
  Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice> *this_local;
  
  this_00 = std::get<0ul,wasm::RandomFullLattice,wasm::RandomFullLattice>
                      ((tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice> *)this);
  a = std::
      get<0ul,wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>
                (joinee);
  b = std::
      get<0ul,wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>
                (joiner);
  bVar1 = RandomFullLattice::join(this_00,a,b);
  uVar2 = Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>::joinImpl<1UL>
                    ((Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice> *)this,joinee,joiner);
  return bVar1 | uVar2;
}

Assistant:

int joinImpl(Element& joinee,
               const Element& joiner,
               std::index_sequence<I, Is...>) const noexcept {
    // Recursive case: join the current element and recurse to the next
    // elements.
    return std::get<I>(lattices).join(std::get<I>(joinee),
                                      std::get<I>(joiner)) |
           joinImpl(joinee, joiner, std::index_sequence<Is...>{});
  }